

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string_sprintf.c
# Opt level: O3

void archive_string_vsprintf(archive_string *as,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  byte bVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  ulong *puVar5;
  long *plVar6;
  uint *puVar7;
  size_t len;
  int *piVar8;
  char *pcVar9;
  byte bVar10;
  uint uVar11;
  char cVar12;
  char *pcVar13;
  wchar_t *__s;
  ulong uVar14;
  
  paVar4 = archive_string_ensure(as,0x40);
  if (paVar4 == (archive_string *)0x0) {
LAB_0040ca21:
    __archive_errx(1,"Out of memory");
  }
  if (fmt == (char *)0x0) {
    *as->s = '\0';
    return;
  }
  do {
    cVar12 = *fmt;
    if (cVar12 == '%') {
      pcVar13 = fmt + 1;
      bVar1 = fmt[1];
      bVar10 = bVar1;
      bVar2 = 0;
      if ((bVar1 - 0x6a < 0x11) && (bVar2 = 0, (0x10005U >> (bVar1 - 0x6a & 0x1f) & 1) != 0)) {
        pcVar13 = fmt + 2;
        bVar10 = fmt[2];
        bVar2 = bVar1;
      }
      if (bVar10 < 99) {
        if (bVar10 == 0x25) {
          cVar12 = '%';
LAB_0040c964:
          archive_strappend_char(as,cVar12);
        }
        else {
          if (bVar10 != 0x53) {
            if (bVar10 == 0x58) goto switchD_0040c79d_caseD_6f;
            goto switchD_0040c79d_caseD_70;
          }
          uVar14 = (ulong)ap->gp_offset;
          if (0x28 < uVar14) goto LAB_0040c89f;
LAB_0040c7eb:
          plVar6 = (long *)(uVar14 + (long)ap->reg_save_area);
          ap->gp_offset = (int)uVar14 + 8;
LAB_0040c8ab:
          __s = anon_var_dwarf_1807da0;
          if ((wchar_t *)*plVar6 != (wchar_t *)0x0) {
            __s = (wchar_t *)*plVar6;
          }
          len = wcslen(__s);
          wVar3 = archive_string_append_from_wcs(as,__s,len);
          if ((wVar3 != L'\0') && (piVar8 = __errno_location(), *piVar8 == 0xc)) goto LAB_0040ca21;
        }
      }
      else {
        switch(bVar10) {
        case 0x6f:
        case 0x75:
        case 0x78:
switchD_0040c79d_caseD_6f:
          uVar11 = ap->gp_offset;
          uVar14 = (ulong)uVar11;
          if (bVar2 == 0x7a) {
            if (uVar11 < 0x29) {
              puVar5 = (ulong *)((long)ap->reg_save_area + uVar14);
              ap->gp_offset = uVar11 + 8;
            }
            else {
LAB_0040c85d:
              puVar5 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 1;
            }
LAB_0040c869:
            uVar14 = *puVar5;
          }
          else {
            if ((bVar2 == 0x6c) || (bVar2 == 0x6a)) {
              if (0x28 < uVar11) goto LAB_0040c85d;
              puVar5 = (ulong *)((long)ap->reg_save_area + uVar14);
              ap->gp_offset = uVar11 + 8;
              goto LAB_0040c869;
            }
            if (uVar11 < 0x29) {
              puVar7 = (uint *)(uVar14 + (long)ap->reg_save_area);
              ap->gp_offset = uVar11 + 8;
            }
            else {
              puVar7 = (uint *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar7 + 2;
            }
            uVar14 = (ulong)*puVar7;
          }
          if (*pcVar13 == 'u') goto LAB_0040c9f7;
          if (*pcVar13 == 'o') {
            uVar11 = 8;
          }
          else {
            uVar11 = 0x10;
          }
          break;
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x76:
        case 0x77:
switchD_0040c79d_caseD_70:
          cVar12 = '%';
          goto LAB_0040c743;
        case 0x73:
          uVar11 = ap->gp_offset;
          uVar14 = (ulong)uVar11;
          if (bVar2 == 0x6c) {
            if (uVar11 < 0x29) goto LAB_0040c7eb;
LAB_0040c89f:
            plVar6 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar6 + 1;
            goto LAB_0040c8ab;
          }
          if (uVar11 < 0x29) {
            plVar6 = (long *)(uVar14 + (long)ap->reg_save_area);
            ap->gp_offset = uVar11 + 8;
          }
          else {
            plVar6 = (long *)ap->overflow_arg_area;
            ap->overflow_arg_area = plVar6 + 1;
          }
          pcVar9 = "(null)";
          if ((char *)*plVar6 != (char *)0x0) {
            pcVar9 = (char *)*plVar6;
          }
          archive_strcat(as,pcVar9);
          goto LAB_0040ca04;
        default:
          if (bVar10 == 99) {
            uVar11 = ap->gp_offset;
            if ((ulong)uVar11 < 0x29) {
              pcVar9 = (char *)((ulong)uVar11 + (long)ap->reg_save_area);
              ap->gp_offset = uVar11 + 8;
            }
            else {
              pcVar9 = (char *)ap->overflow_arg_area;
              ap->overflow_arg_area = pcVar9 + 8;
            }
            cVar12 = *pcVar9;
            goto LAB_0040c964;
          }
          if (bVar10 != 100) goto switchD_0040c79d_caseD_70;
          uVar11 = ap->gp_offset;
          uVar14 = (ulong)uVar11;
          if (bVar2 == 0x7a) {
            if (uVar11 < 0x29) {
              puVar5 = (ulong *)((long)ap->reg_save_area + uVar14);
              ap->gp_offset = uVar11 + 8;
            }
            else {
LAB_0040c9a9:
              puVar5 = (ulong *)ap->overflow_arg_area;
              ap->overflow_arg_area = puVar5 + 1;
            }
LAB_0040c9b5:
            uVar14 = *puVar5;
          }
          else {
            if ((bVar2 == 0x6c) || (bVar2 == 0x6a)) {
              if (0x28 < uVar11) goto LAB_0040c9a9;
              puVar5 = (ulong *)((long)ap->reg_save_area + uVar14);
              ap->gp_offset = uVar11 + 8;
              goto LAB_0040c9b5;
            }
            if (uVar11 < 0x29) {
              piVar8 = (int *)(uVar14 + (long)ap->reg_save_area);
              ap->gp_offset = uVar11 + 8;
            }
            else {
              piVar8 = (int *)ap->overflow_arg_area;
              ap->overflow_arg_area = piVar8 + 2;
            }
            uVar14 = (ulong)*piVar8;
          }
          if ((long)uVar14 < 0) {
            archive_strappend_char(as,'-');
            uVar14 = -uVar14;
          }
LAB_0040c9f7:
          uVar11 = 10;
        }
        append_uint(as,uVar14,uVar11);
      }
    }
    else {
      if (cVar12 == '\0') {
        return;
      }
LAB_0040c743:
      archive_strappend_char(as,cVar12);
      pcVar13 = fmt;
    }
LAB_0040ca04:
    fmt = pcVar13 + 1;
  } while( true );
}

Assistant:

void
archive_string_vsprintf(struct archive_string *as, const char *fmt,
    va_list ap)
{
	char long_flag;
	intmax_t s; /* Signed integer temp. */
	uintmax_t u; /* Unsigned integer temp. */
	const char *p, *p2;
	const wchar_t *pw;

	if (archive_string_ensure(as, 64) == NULL)
		__archive_errx(1, "Out of memory");

	if (fmt == NULL) {
		as->s[0] = 0;
		return;
	}

	for (p = fmt; *p != '\0'; p++) {
		const char *saved_p = p;

		if (*p != '%') {
			archive_strappend_char(as, *p);
			continue;
		}

		p++;

		long_flag = '\0';
		switch(*p) {
		case 'j':
		case 'l':
		case 'z':
			long_flag = *p;
			p++;
			break;
		}

		switch (*p) {
		case '%':
			archive_strappend_char(as, '%');
			break;
		case 'c':
			s = va_arg(ap, int);
			archive_strappend_char(as, (char)s);
			break;
		case 'd':
			switch(long_flag) {
			case 'j': s = va_arg(ap, intmax_t); break;
			case 'l': s = va_arg(ap, long); break;
			case 'z': s = va_arg(ap, ssize_t); break;
			default:  s = va_arg(ap, int); break;
			}
		        append_int(as, s, 10);
			break;
		case 's':
			switch(long_flag) {
			case 'l':
				pw = va_arg(ap, wchar_t *);
				if (pw == NULL)
					pw = L"(null)";
				if (archive_string_append_from_wcs(as, pw,
				    wcslen(pw)) != 0 && errno == ENOMEM)
					__archive_errx(1, "Out of memory");
				break;
			default:
				p2 = va_arg(ap, char *);
				if (p2 == NULL)
					p2 = "(null)";
				archive_strcat(as, p2);
				break;
			}
			break;
		case 'S':
			pw = va_arg(ap, wchar_t *);
			if (pw == NULL)
				pw = L"(null)";
			if (archive_string_append_from_wcs(as, pw,
			    wcslen(pw)) != 0 && errno == ENOMEM)
				__archive_errx(1, "Out of memory");
			break;
		case 'o': case 'u': case 'x': case 'X':
			/* Common handling for unsigned integer formats. */
			switch(long_flag) {
			case 'j': u = va_arg(ap, uintmax_t); break;
			case 'l': u = va_arg(ap, unsigned long); break;
			case 'z': u = va_arg(ap, size_t); break;
			default:  u = va_arg(ap, unsigned int); break;
			}
			/* Format it in the correct base. */
			switch (*p) {
			case 'o': append_uint(as, u, 8); break;
			case 'u': append_uint(as, u, 10); break;
			default: append_uint(as, u, 16); break;
			}
			break;
		default:
			/* Rewind and print the initial '%' literally. */
			p = saved_p;
			archive_strappend_char(as, *p);
		}
	}
}